

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.h
# Opt level: O1

SQInstance * __thiscall SQInstance::Clone(SQInstance *this,SQSharedState *ss)

{
  SQInstance *this_00;
  SQUnsignedInteger SVar1;
  long lVar2;
  
  SVar1 = (this->_class->_defaultvalues)._size;
  lVar2 = 0x68;
  if (SVar1 != 0) {
    lVar2 = SVar1 * 0x10 + 0x58;
  }
  SVar1 = lVar2 + this->_class->_udsize;
  this_00 = (SQInstance *)sq_vm_malloc(SVar1);
  SQInstance(this_00,ss,this,SVar1);
  lVar2 = this->_class->_udsize;
  if (lVar2 != 0) {
    this_00->_userpointer = (SQUserPointer)((long)this_00 + (SVar1 - lVar2));
  }
  return this_00;
}

Assistant:

SQInstance *Clone(SQSharedState *ss)
    {
        SQInteger size = calcinstancesize(_class);
        SQInstance *newinst = (SQInstance *)SQ_MALLOC(size);
        new (newinst) SQInstance(ss, this,size);
        if(_class->_udsize) {
            newinst->_userpointer = ((unsigned char *)newinst) + (size - _class->_udsize);
        }
        return newinst;
    }